

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O3

Aig_Obj_t * Aig_TableLookupInt(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  ulong uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  
  pAVar3 = p0;
  if (p0 != p1) {
    pAVar2 = p->pConst1;
    pAVar3 = (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
    if ((((pAVar3 != p1 && pAVar3 != p0) && ((Aig_Obj_t *)((ulong)p1 ^ 1) != p0)) &&
        (pAVar3 = p1, pAVar2 != p0)) && (pAVar3 = p0, pAVar2 != p1)) {
      uVar1 = (ulong)p0 & 0xfffffffffffffffe;
      uVar4 = (ulong)p1 & 0xfffffffffffffffe;
      if (*(int *)(uVar1 + 0x24) < *(int *)(uVar4 + 0x24)) {
        if ((*(uint *)(uVar1 + 0x18) & 7) != 1) {
          if (p1 == (Aig_Obj_t *)0x0) {
            if (uVar1 == 0) {
LAB_006c43e4:
              __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x15f,
                            "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                           );
            }
            *(ulong *)&(p->Ghost).field_0x18 =
                 *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
            pAVar2 = (Aig_Obj_t *)0x0;
          }
          else {
            if ((*(uint *)(uVar4 + 0x18) & 7) == 1) {
LAB_006c4403:
              __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x15e,
                            "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                           );
            }
            if (uVar1 == uVar4) goto LAB_006c43e4;
            *(ulong *)&(p->Ghost).field_0x18 =
                 *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
            pAVar2 = p0;
            pAVar3 = p1;
            if (*(int *)(uVar1 + 0x24) < *(int *)(uVar4 + 0x24)) {
              pAVar2 = p1;
              pAVar3 = p0;
            }
          }
LAB_006c43b3:
          (p->Ghost).pFanin0 = pAVar3;
          (p->Ghost).pFanin1 = pAVar2;
          pAVar3 = Aig_TableLookup(p,&p->Ghost);
          return pAVar3;
        }
      }
      else if ((*(uint *)(uVar4 + 0x18) & 7) != 1) {
        if (p0 == (Aig_Obj_t *)0x0) {
          if (uVar4 == 0) goto LAB_006c43e4;
          *(ulong *)&(p->Ghost).field_0x18 =
               *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
          pAVar2 = (Aig_Obj_t *)0x0;
          pAVar3 = p1;
        }
        else {
          if ((*(uint *)(uVar1 + 0x18) & 7) == 1) goto LAB_006c4403;
          if (uVar4 == uVar1) goto LAB_006c43e4;
          *(ulong *)&(p->Ghost).field_0x18 =
               *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
          pAVar2 = p1;
          if (*(int *)(uVar4 + 0x24) < *(int *)(uVar1 + 0x24)) {
            pAVar2 = p0;
            pAVar3 = p1;
          }
        }
        goto LAB_006c43b3;
      }
      __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x15d,
                    "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                   );
    }
  }
  return pAVar3;
}

Assistant:

Aig_Obj_t * Aig_TableLookupInt( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_ManConst0(p) || p1 == Aig_ManConst0(p) || p0 == Aig_Not(p1) )
        return Aig_ManConst0(p);
    if ( p0 == Aig_ManConst1(p) )
        return p1;
    if ( p1 == Aig_ManConst1(p) )
        return p0;
    if ( Aig_Regular(p0)->Id < Aig_Regular(p1)->Id )
        return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p0, p1, AIG_OBJ_AND) );
    return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p1, p0, AIG_OBJ_AND) );
}